

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

bool __thiscall
QGraphicsItem::isBlockedByModalPanel(QGraphicsItem *this,QGraphicsItem **blockingPanel)

{
  QGraphicsScene *pQVar1;
  long lVar2;
  QGraphicsItem *this_00;
  bool bVar3;
  QGraphicsItem *pQVar4;
  ulong uVar5;
  bool bVar6;
  
  pQVar1 = ((this->d_ptr).d)->scene;
  if (((pQVar1 == (QGraphicsScene *)0x0) ||
      (lVar2 = *(long *)&pQVar1->field_0x8, *(long *)(lVar2 + 0x380) == 0)) ||
     ((*(long *)(lVar2 + 0x1d0) != 0 &&
      (**(long **)(lVar2 + 0x1c8) != 0 &&
       (QGraphicsItem *)(**(long **)(lVar2 + 0x1c8) + 0x10) == this)))) {
    bVar6 = false;
  }
  else {
    bVar6 = *(long *)(lVar2 + 0x380) != 0;
    if (bVar6) {
      uVar5 = 0;
      do {
        this_00 = *(QGraphicsItem **)(*(long *)(lVar2 + 0x378) + uVar5 * 8);
        if (((this_00->d_ptr).d)->panelModality == SceneModal) {
          if ((this_00 != this) && (bVar3 = isAncestorOf(this_00,this), !bVar3)) {
LAB_005e850e:
            if (blockingPanel == (QGraphicsItem **)0x0) {
              return bVar6;
            }
            *blockingPanel = this_00;
            return bVar6;
          }
        }
        else if (((this_00 != this) && (bVar3 = isAncestorOf(this_00,this), !bVar3)) &&
                (pQVar4 = commonAncestorItem(this,this_00), pQVar4 != (QGraphicsItem *)0x0))
        goto LAB_005e850e;
        uVar5 = uVar5 + 1;
        bVar6 = uVar5 < *(ulong *)(lVar2 + 0x380);
      } while (uVar5 < *(ulong *)(lVar2 + 0x380));
    }
  }
  return bVar6;
}

Assistant:

T *operator->() const noexcept
    {
        return d;
    }